

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.hpp
# Opt level: O2

void __thiscall OpenMD::NPTf::~NPTf(NPTf *this)

{
  NPT::~NPT(&this->super_NPT);
  operator_delete(this,0x328);
  return;
}

Assistant:

NPTf(SimInfo* info) : NPT(info) {}